

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.h
# Opt level: O2

void __thiscall
jbcoin::STObject::Proxy<jbcoin::STInteger<unsigned_int>>::assign<unsigned_int&>
          (Proxy<jbcoin::STInteger<unsigned_int>> *this,uint *u)

{
  STBase *pSVar1;
  long lVar2;
  
  if ((*(int *)(this + 8) == 2) && (*u == 0)) {
    makeFieldAbsent(*(STObject **)this,*(SField **)(this + 0x10));
    return;
  }
  if (*(int *)(this + 8) == -1) {
    pSVar1 = getPField(*(STObject **)this,*(SField **)(this + 0x10),true);
  }
  else {
    pSVar1 = makeFieldPresent(*(STObject **)this,*(SField **)(this + 0x10));
  }
  if (pSVar1 != (STBase *)0x0) {
    lVar2 = __dynamic_cast(pSVar1,&STBase::typeinfo,&STInteger<unsigned_int>::typeinfo,0);
    if (lVar2 != 0) {
      *(uint *)(lVar2 + 0x10) = *u;
      return;
    }
  }
  __assert_fail("t",
                "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/STObject.h"
                ,0x2dc,
                "void jbcoin::STObject::Proxy<jbcoin::STInteger<unsigned int>>::assign(U &&) [T = jbcoin::STInteger<unsigned int>, U = unsigned int &]"
               );
}

Assistant:

void
STObject::Proxy<T>::assign(U&& u)
{
    if (style_ == SOE_DEFAULT &&
        u == value_type{})
    {
        st_->makeFieldAbsent(*f_);
        return;
    }
    T* t;
    if (style_ == SOE_INVALID)
        t = dynamic_cast<T*>(
            st_->getPField(*f_, true));
    else
        t = dynamic_cast<T*>(
            st_->makeFieldPresent(*f_));
    assert(t);
    *t = std::forward<U>(u);
}